

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O0

void __thiscall Map::eachScene(Map *this,SceneStrategy *strategy)

{
  bool bVar1;
  reference ppSVar2;
  Scene *i;
  iterator __end1;
  iterator __begin1;
  vector<Scene_*,_std::allocator<Scene_*>_> *__range1;
  SceneStrategy *strategy_local;
  Map *this_local;
  
  std::operator<<((ostream *)&std::cout,"class:Map method:eachScene\n");
  __end1 = std::vector<Scene_*,_std::allocator<Scene_*>_>::begin(&this->scenes);
  i = (Scene *)std::vector<Scene_*,_std::allocator<Scene_*>_>::end(&this->scenes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Scene_**,_std::vector<Scene_*,_std::allocator<Scene_*>_>_>
                                *)&i);
    if (!bVar1) break;
    ppSVar2 = __gnu_cxx::
              __normal_iterator<Scene_**,_std::vector<Scene_*,_std::allocator<Scene_*>_>_>::
              operator*(&__end1);
    (*(code *)**(undefined8 **)strategy)(strategy,*ppSVar2);
    __gnu_cxx::__normal_iterator<Scene_**,_std::vector<Scene_*,_std::allocator<Scene_*>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void Map::eachScene(SceneStrategy *strategy) {
    std::cout << "class:Map method:eachScene\n";
    for (auto i : scenes) {
        strategy->act(i);
    }
}